

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_writer.cpp
# Opt level: O1

buffer_writer * __thiscall buffer_writer::operator<<(buffer_writer *this,uint8_t data)

{
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  iterator __position;
  uint8_t local_9;
  
  this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)this->_buffer;
  __position._M_current = *(uchar **)(this_00 + 8);
  if (__position._M_current == *(uchar **)(this_00 + 0x10)) {
    local_9 = data;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>(this_00,__position,&local_9);
  }
  else {
    *__position._M_current = data;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 1;
  }
  return this;
}

Assistant:

buffer_writer& buffer_writer::operator<<(std::uint8_t data)
{
    _buffer.push_back(data);

    return *this;
}